

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O0

Config * __thiscall Jupiter::Config::getSection(Config *this,string_view in_key)

{
  bool bVar1;
  unordered_map<std::__cxx11::string,Jupiter::Config,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>>
  *this_00;
  pointer this_01;
  pointer ppVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
  local_30;
  iterator section;
  Config *this_local;
  string_view in_key_local;
  
  in_key_local._M_len = (size_t)in_key._M_str;
  this_local = (Config *)in_key._M_len;
  section.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>
               )this;
  bVar1 = std::operator==(&this->m_sections,(nullptr_t)0x0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = (unordered_map<std::__cxx11::string,Jupiter::Config,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>>
               *)std::
                 unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
                 ::operator->(&this->m_sections);
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::string,Jupiter::Config,jessilib::text_hashi,jessilib::text_equali,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>>
         ::find<std::basic_string_view<char,std::char_traits<char>>>
                   (this_00,(basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    this_01 = std::
              unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
              ::operator->(&this->m_sections);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
         ::end(this_01);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false,_false>
                             *)&local_30);
      return &ppVar2->second;
    }
  }
  return (Config *)0x0;
}

Assistant:

Jupiter::Config *Jupiter::Config::getSection(std::string_view in_key) const {
	if (m_sections != nullptr) {
		auto section = m_sections->find(JUPITER_WRAP_MAP_KEY(in_key));
		if (section != m_sections->end()) {
			return &section->second;
		}
	}

	return nullptr;
}